

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatchesRegexMatcher::DescribeNegationTo(MatchesRegexMatcher *this,ostream *os)

{
  ostream *poVar1;
  element_type *this_00;
  ostream *in_RSI;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostream *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [48];
  
  poVar1 = std::operator<<(in_RSI,"doesn\'t ");
  pcVar2 = "contain";
  if (((in_RDI->field_2)._M_local_buf[0] & 1U) != 0) {
    pcVar2 = "match";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1," regular expression ");
  this_00 = std::
            __shared_ptr_access<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x10d7f7);
  pcVar2 = RE::pattern(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar2,&local_31);
  UniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Print(in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void DescribeNegationTo(::std::ostream* os) const {
    *os << "doesn't " << (full_match_ ? "match" : "contain")
        << " regular expression ";
    UniversalPrinter<std::string>::Print(regex_->pattern(), os);
  }